

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O2

void Prs_ManWriteVerilog(char *pFileName,Vec_Ptr_t *vPrs)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Prs_Ntk_t *pPVar7;
  FILE *__stream;
  char *pcVar8;
  char *pcVar9;
  Vec_Int_t *p;
  long lVar10;
  ulong uVar11;
  int i_00;
  long lVar12;
  int i;
  int iVar13;
  size_t sStack_3c0;
  Vec_Int_t *local_348 [4];
  Vec_Int_t *vSigs [4];
  char *pTypeNames [90];
  
  if (vPrs->nSize < 1) {
    pPVar7 = (Prs_Ntk_t *)0x0;
  }
  else {
    pPVar7 = (Prs_Ntk_t *)Vec_PtrEntry(vPrs,0);
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  memset(pTypeNames,0,0x2b8);
  pTypeNames[0x58] = "sli";
  pTypeNames[0x59] = "icc";
  pTypeNames[8] = "";
  pTypeNames[9] = "~";
  pTypeNames[10] = "&";
  pTypeNames[0xb] = "&";
  pTypeNames[0xc] = "|";
  pTypeNames[0xd] = "|";
  pTypeNames[0xe] = "^";
  pTypeNames[0xf] = "^";
  pTypeNames[0x10] = "&";
  pTypeNames[0x11] = "&";
  pTypeNames[0x12] = "?";
  pTypeNames[0x13] = "maj";
  pTypeNames[0x1b] = "&";
  pTypeNames[0x1c] = "~&";
  pTypeNames[0x1d] = "|";
  pTypeNames[0x1e] = "~|";
  pTypeNames[0x1f] = "^";
  pTypeNames[0x20] = "~^";
  pTypeNames[0x21] = "!";
  pTypeNames[0x22] = "&&";
  pTypeNames[0x23] = "logic nand";
  pTypeNames[0x24] = "||";
  pTypeNames[0x25] = "logic nor";
  pTypeNames[0x26] = "^^";
  pTypeNames[0x27] = "logic xnor";
  pTypeNames[0x28] = "nmux";
  pTypeNames[0x29] = "sel";
  pTypeNames[0x2a] = "prio-select";
  pTypeNames[0x2b] = "enc";
  pTypeNames[0x2c] = "prio-enc";
  pTypeNames[0x2d] = "dec";
  pTypeNames[0x2e] = "enable-dec";
  pTypeNames[0x2f] = "+";
  pTypeNames[0x30] = "-";
  pTypeNames[0x31] = "*";
  pTypeNames[0x33] = "/";
  pTypeNames[0x34] = "%";
  pTypeNames[0x35] = "%";
  pTypeNames[0x36] = "**";
  pTypeNames[0x37] = "-";
  pTypeNames[0x38] = "@";
  pTypeNames[0x39] = "abs";
  pTypeNames[0x3b] = "<";
  pTypeNames[0x3c] = "<=";
  pTypeNames[0x3d] = ">=";
  pTypeNames[0x3e] = ">";
  pTypeNames[0x3f] = "==";
  pTypeNames[0x40] = "!=";
  pTypeNames[0x41] = "<<";
  pTypeNames[0x42] = ">>";
  pTypeNames[0x43] = "<<<";
  pTypeNames[0x44] = ">>>";
  pTypeNames[0x45] = "rotL";
  pTypeNames[0x46] = "rotR";
  pTypeNames[0x4b] = "tri";
  pTypeNames[0x4c] = "ram";
  pTypeNames[0x4d] = "ramR";
  pTypeNames[0x4e] = "ramW";
  pTypeNames[0x4f] = "ramWC";
  pTypeNames[0x52] = "ramBox";
  pTypeNames[0x53] = "lat";
  pTypeNames[0x54] = "latrs";
  pTypeNames[0x55] = "dff";
  pTypeNames[0x57] = "dffrs";
  pcVar8 = Prs_NtkStr(pPVar7,pPVar7->iModuleName);
  pcVar9 = Extra_TimeStamp();
  fprintf(__stream,"// Design \"%s\" written by ABC on %s\n\n",pcVar8,pcVar9);
  i_00 = 0;
  do {
    if (vPrs->nSize <= i_00) {
      fclose(__stream);
      return;
    }
    pPVar7 = (Prs_Ntk_t *)Vec_PtrEntry(vPrs,i_00);
    pcVar8 = Prs_ObjGetName(pPVar7,pPVar7->iModuleName);
    fprintf(__stream,"module %s (\n    ",pcVar8);
    for (iVar13 = 0; iVar13 < (pPVar7->vOrder).nSize; iVar13 = iVar13 + 1) {
      iVar2 = Vec_IntEntry(&pPVar7->vOrder,iVar13);
      iVar2 = Abc_Lit2Var2(iVar2);
      pcVar9 = Prs_ObjGetName(pPVar7,iVar2);
      pcVar8 = "    \"%s\", ";
      if (iVar13 == (pPVar7->vOrder).nSize + -1) {
        pcVar8 = "T = %d\t\t";
      }
      fprintf(__stream,"%s%s",pcVar9,pcVar8 + 8);
    }
    fwrite("\n  );\n",6,1,__stream);
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      vSigs[0] = &pPVar7->vInouts;
      vSigs[1] = &pPVar7->vInputs;
      vSigs[2] = &pPVar7->vOutputs;
      vSigs[3] = &pPVar7->vWires;
      local_348[0] = &pPVar7->vInoutsR;
      local_348[1] = &pPVar7->vInputsR;
      local_348[2] = &pPVar7->vOutputsR;
      local_348[3] = &pPVar7->vWiresR;
      if (lVar10 == 3) {
        fputc(10,__stream);
      }
      pVVar1 = vSigs[lVar10];
      for (iVar13 = 0; iVar13 < pVVar1->nSize; iVar13 = iVar13 + 1) {
        iVar3 = Vec_IntEntry(pVVar1,iVar13);
        iVar4 = Vec_IntEntry(local_348[lVar10],iVar13);
        iVar2 = *(int *)(&DAT_006d2628 + lVar10 * 4);
        iVar5 = Abc_LitIsCompl(iVar4);
        pcVar9 = "signed ";
        pcVar8 = "";
        if (iVar5 == 0) {
          pcVar9 = "";
        }
        if (iVar4 != 0) {
          iVar4 = Abc_Lit2Var(iVar4);
          pcVar8 = Prs_ManWriteRange(pPVar7,iVar4,0);
        }
        fprintf(__stream,"  %s %s%s",&DAT_006d2628 + iVar2,pcVar9,pcVar8);
        pcVar8 = Prs_ObjGetName(pPVar7,iVar3);
        fprintf(__stream,"%s;\n",pcVar8);
      }
    }
    fputc(10,__stream);
    pVVar1 = &pPVar7->vBoxes;
    p = &pPVar7->vObjs;
    for (iVar13 = 0; iVar13 < (pPVar7->vObjs).nSize; iVar13 = iVar13 + 1) {
      iVar2 = Vec_IntEntry(p,iVar13);
      iVar2 = Vec_IntEntry(pVVar1,iVar2);
      Prs_BoxSignals_V._0_4_ = iVar2 + -2;
      Prs_BoxSignals_V._4_4_ = Prs_BoxSignals_V._0_4_;
      iVar2 = Vec_IntEntry(p,iVar13);
      Prs_BoxSignals_V._8_8_ = Vec_IntEntryP(pVVar1,iVar2 + 3);
      iVar2 = Vec_IntEntry(p,iVar13);
      uVar6 = Vec_IntEntry(pVVar1,iVar2 + 1);
      if ((uVar6 == 0x12) && (iVar2 = Prs_BoxIsNode(pPVar7,iVar13), iVar2 != 0)) {
        if (Prs_BoxSignals_V._4_4_ != 8) {
          __assert_fail("Vec_IntSize(vSigs) == 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                        ,0xdd,"void Prs_ManWriteVerilogMux(FILE *, Prs_Ntk_t *, Vec_Int_t *)");
        }
        fwrite("  assign ",9,1,__stream);
        iVar2 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,1);
        Prs_ManWriteVerilogSignal((FILE *)__stream,pPVar7,iVar2);
        fputs(" = ",__stream);
        lVar12 = 2;
        for (lVar10 = 3; lVar10 < (int)Prs_BoxSignals_V._4_4_; lVar10 = lVar10 + 2) {
          Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,(int)lVar12);
          iVar2 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,(int)lVar10);
          Prs_ManWriteVerilogSignal((FILE *)__stream,pPVar7,iVar2);
          fputs(&DAT_006d2638 + *(int *)(&DAT_006d2638 + lVar12 * 2),__stream);
          lVar12 = lVar12 + 2;
        }
      }
      else {
        iVar2 = Prs_BoxIsNode(pPVar7,iVar13);
        if (iVar2 == 0) {
          pcVar8 = Prs_ObjGetName(pPVar7,uVar6);
          iVar2 = Prs_BoxName(pPVar7,iVar13);
          pcVar9 = "";
          if (iVar2 != 0) {
            iVar2 = Prs_BoxName(pPVar7,iVar13);
            pcVar9 = Prs_ObjGetName(pPVar7,iVar2);
          }
          fprintf(__stream,"  %s %s ( ",pcVar8,pcVar9);
          if ((Prs_BoxSignals_V._4_4_ & 1) != 0) {
            __assert_fail("Vec_IntSize(vSigs) % 2 == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                          ,0xcf,"void Prs_ManWriteVerilogArray2(FILE *, Prs_Ntk_t *, Vec_Int_t *)");
          }
          for (iVar2 = 0; iVar2 + 1 < (int)Prs_BoxSignals_V._4_4_; iVar2 = iVar2 + 2) {
            iVar3 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,iVar2);
            iVar4 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,iVar2 + 1);
            fputc(0x2e,__stream);
            pcVar8 = Prs_ObjGetName(pPVar7,iVar3);
            fputs(pcVar8,__stream);
            fputc(0x28,__stream);
            Prs_ManWriteVerilogSignal((FILE *)__stream,pPVar7,iVar4);
            pcVar8 = "    \"%s\", ";
            if (iVar2 == Prs_BoxSignals_V._4_4_ + -2) {
              pcVar8 = "T = %d\t\t";
            }
            fprintf(__stream,")%s",pcVar8 + 8);
          }
          pcVar8 = " );\n";
          sStack_3c0 = 4;
        }
        else {
          fwrite("  assign ",9,1,__stream);
          iVar2 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,1);
          Prs_ManWriteVerilogSignal((FILE *)__stream,pPVar7,iVar2);
          fwrite(" = ",3,1,__stream);
          uVar11 = (ulong)uVar6;
          if (((uVar6 < 0x3a) && ((0x380000200000300U >> (uVar11 & 0x3f) & 1) != 0)) ||
             (0xfffffff9 < uVar6 - 0x21)) {
            fputs(pTypeNames[uVar11],__stream);
            iVar2 = 3;
LAB_002eedae:
            iVar2 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,iVar2);
            Prs_ManWriteVerilogSignal((FILE *)__stream,pPVar7,iVar2);
          }
          else {
            iVar2 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,3);
            if (uVar6 == 0x2f) {
              if (iVar2 != 0) {
                iVar2 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,3);
                Prs_ManWriteVerilogSignal((FILE *)__stream,pPVar7,iVar2);
                fprintf(__stream," %s ","+");
              }
              iVar2 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,5);
              Prs_ManWriteVerilogSignal((FILE *)__stream,pPVar7,iVar2);
              fprintf(__stream," %s ","+");
              iVar2 = 7;
              goto LAB_002eedae;
            }
            if (uVar6 != 0x28) {
              Prs_ManWriteVerilogSignal((FILE *)__stream,pPVar7,iVar2);
              fprintf(__stream," %s ",pTypeNames[uVar11]);
              iVar2 = 5;
              goto LAB_002eedae;
            }
            Prs_ManWriteVerilogSignal((FILE *)__stream,pPVar7,iVar2);
            fwrite(" ? ",3,1,__stream);
            for (uVar6 = 5; (int)uVar6 < (int)Prs_BoxSignals_V._4_4_; uVar6 = uVar6 + 2) {
              if (5 < uVar6) {
                fwrite(" : ",3,1,__stream);
              }
              iVar2 = Vec_IntEntry((Vec_Int_t *)Prs_BoxSignals_V,uVar6);
              Prs_ManWriteVerilogSignal((FILE *)__stream,pPVar7,iVar2);
            }
          }
          pcVar8 = ";\n";
          sStack_3c0 = 2;
        }
        fwrite(pcVar8,sStack_3c0,1,__stream);
      }
    }
    fwrite("endmodule\n\n",0xb,1,__stream);
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Prs_ManWriteVerilog( char * pFileName, Vec_Ptr_t * vPrs )
{
    char * pTypeNames[CBA_BOX_LAST];
    Prs_Ntk_t * pNtk = Prs_ManRoot(vPrs); int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    Cba_ManCreatePrimMap( pTypeNames );
    fprintf( pFile, "// Design \"%s\" written by ABC on %s\n\n", Prs_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Prs_Ntk_t *, vPrs, pNtk, i )
        Prs_ManWriteVerilogNtk( pFile, pNtk, pTypeNames );
    fclose( pFile );
}